

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O1

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char>,char[38]>
          (QTest *this,StringStream<char> *left,char (*right) [38],unsigned_long line)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((this->error_ == true) && (this->continue_on_error_ != true)) {
    return;
  }
  if ((*right)[0] == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      lVar1 = uVar2 + 1;
      uVar2 = uVar2 + 1;
    } while ((*right)[lVar1] != '\0');
  }
  if (left->length_ == (SizeT)uVar2) {
    uVar3 = uVar2 & 0xffffffff;
    if (uVar3 == 0) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if (left->storage_[uVar4] != (*right)[uVar4]) break;
        uVar4 = uVar4 + 1;
        uVar5 = uVar3;
      } while (uVar3 != uVar4);
    }
    if ((SizeT)uVar5 == (SizeT)uVar2) {
      return;
    }
  }
  this->error_ = true;
  PrintErrorMessage<Qentem::StringStream<char>,char[38]>(this,false,left,right,line);
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }